

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketnonblocking.cpp
# Opt level: O3

int __thiscall hbm::SocketNonblocking::init(SocketNonblocking *this,EVP_PKEY_CTX *ctx)

{
  int __fd;
  int iVar1;
  int opt;
  undefined4 local_1c;
  
  local_1c = 1;
  iVar1 = 0;
  __fd = socket(2,0x801,0);
  this->m_fd = __fd;
  if (__fd == -1) {
    iVar1 = -1;
  }
  else {
    setsockopt(__fd,6,1,&local_1c,4);
    local_1c = 0xc;
    setsockopt(this->m_fd,6,4,&local_1c,4);
    local_1c = 3;
    setsockopt(this->m_fd,6,5,&local_1c,4);
    local_1c = 2;
    setsockopt(this->m_fd,6,6,&local_1c,4);
    local_1c = 1;
    setsockopt(this->m_fd,1,9,&local_1c,4);
  }
  return iVar1;
}

Assistant:

int hbm::SocketNonblocking::init()
{
	int retVal = 0;
	int opt = 1;

	m_fd = ::socket(AF_INET, SOCK_STREAM | SOCK_NONBLOCK, 0);
	if(m_fd==-1) {
		retVal=-1;
	} else {
		// turn off Nagle algorithm
		setsockopt(m_fd, IPPROTO_TCP, TCP_NODELAY, reinterpret_cast<char*>(&opt), sizeof(opt));

		opt = 12;
		// the interval between the last data packet sent (simple ACKs are not considered data) and the first keepalive probe;
		// after the connection is marked to need keepalive, this counter is not used any further
		setsockopt(m_fd, SOL_TCP, TCP_KEEPIDLE, reinterpret_cast<char*>(&opt), sizeof(opt));

		opt = 3;
		// the interval between subsequential keepalive probes, regardless of what the connection has exchanged in the meantime
		setsockopt(m_fd, SOL_TCP, TCP_KEEPINTVL, reinterpret_cast<char*>(&opt), sizeof(opt));

		opt = 2;
		// the number of unacknowledged probes to send before considering the connection dead and notifying the application layer
		setsockopt(m_fd, SOL_TCP, TCP_KEEPCNT, reinterpret_cast<char*>(&opt), sizeof(opt));

		opt = 1;
		setsockopt(m_fd, SOL_SOCKET, SO_KEEPALIVE, reinterpret_cast<char*>(&opt), sizeof(opt));
	}

	return retVal;
}